

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties
          (DecimalFormatProperties *this)

{
  DecimalFormatProperties *this_local;
  
  NullableValue<UNumberCompactStyle>::NullableValue(&this->compactStyle);
  NullableValue<icu_63::CurrencyUnit>::NullableValue(&this->currency);
  CurrencyPluralInfoWrapper::CurrencyPluralInfoWrapper(&this->currencyPluralInfo);
  NullableValue<UCurrencyUsage>::NullableValue(&this->currencyUsage);
  UnicodeString::UnicodeString(&this->negativePrefix);
  UnicodeString::UnicodeString(&this->negativePrefixPattern);
  UnicodeString::UnicodeString(&this->negativeSuffix);
  UnicodeString::UnicodeString(&this->negativeSuffixPattern);
  NullableValue<UNumberFormatPadPosition>::NullableValue(&this->padPosition);
  UnicodeString::UnicodeString(&this->padString);
  NullableValue<icu_63::number::impl::ParseMode>::NullableValue(&this->parseMode);
  UnicodeString::UnicodeString(&this->positivePrefix);
  UnicodeString::UnicodeString(&this->positivePrefixPattern);
  UnicodeString::UnicodeString(&this->positiveSuffix);
  UnicodeString::UnicodeString(&this->positiveSuffixPattern);
  NullableValue<UNumberFormatRoundingMode>::NullableValue(&this->roundingMode);
  clear(this);
  return;
}

Assistant:

DecimalFormatProperties::DecimalFormatProperties() {
    clear();
}